

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O2

void Imf_2_5::optimizedWriteToRGB
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **writePtr,size_t *pixelsToCopySSE,
               size_t *pixelsToCopyNormal)

{
  unsigned_short *puVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar2 = (ulong)*readPtrGreen | (ulong)*readPtrRed | (ulong)*readPtrBlue;
  puVar1 = *writePtr;
  if (((ulong)puVar1 & 0xf) == 0 || (uVar2 & 0xf) == 0) {
    bVar3 = ((ulong)puVar1 & 0xf) == 0;
    if ((uVar2 & 0xf) != 0 && bVar3) {
      writeToRGBSSETemplate<false,true>
                ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                 (__m128i **)writePtr,pixelsToCopySSE);
    }
    else {
      bVar4 = (uVar2 & 0xf) != 0;
      if ((((ulong)puVar1 & 0xf) == 0) || (bVar4)) {
        if (!bVar4 && bVar3) {
          writeToRGBSSETemplate<true,true>
                    ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                     (__m128i **)writePtr,pixelsToCopySSE);
        }
      }
      else {
        writeToRGBSSETemplate<true,false>
                  ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                   (__m128i **)writePtr,pixelsToCopySSE);
      }
    }
  }
  else {
    writeToRGBSSETemplate<false,false>
              ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
               (__m128i **)writePtr,pixelsToCopySSE);
  }
  writeToRGBNormal(readPtrRed,readPtrGreen,readPtrBlue,writePtr,pixelsToCopyNormal);
  return;
}

Assistant:

EXR_FORCEINLINE 
void optimizedWriteToRGB (unsigned short*& readPtrRed,
                          unsigned short*& readPtrGreen,
                          unsigned short*& readPtrBlue,
                          unsigned short*& writePtr,
                          const size_t& pixelsToCopySSE,
                          const size_t& pixelsToCopyNormal)
{
    bool readPtrAreAligned = true;

    readPtrAreAligned &= isPointerSSEAligned(readPtrRed);
    readPtrAreAligned &= isPointerSSEAligned(readPtrGreen);
    readPtrAreAligned &= isPointerSSEAligned(readPtrBlue);

    bool writePtrIsAligned = isPointerSSEAligned(writePtr);

    if (!readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, false> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if (!readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<false, true> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, false> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }
    else if (readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBSSETemplate<true, true> ((__m128i*&)readPtrRed,
                                           (__m128i*&)readPtrGreen,
                                           (__m128i*&)readPtrBlue,
                                           (__m128i*&)writePtr,
                                           pixelsToCopySSE);
    }


    writeToRGBNormal (readPtrRed, readPtrGreen, readPtrBlue,
                      writePtr, pixelsToCopyNormal);
}